

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

bool __thiscall
Shell::Options::RatioOptionValue::readRatio(RatioOptionValue *this,char *val,char separator)

{
  bool bVar1;
  size_t sVar2;
  char in_DL;
  char *in_RSI;
  long in_RDI;
  bool found;
  int colonIndex;
  int weight;
  int weight_1;
  int age;
  char copy [128];
  bool local_b3;
  int local_ac;
  int local_9c;
  int local_98;
  int local_94 [3];
  char local_88 [128];
  
  bVar1 = false;
  local_ac = 0;
  do {
    if (in_RSI[local_ac] == '\0') {
LAB_005a0b15:
      if (bVar1) {
        sVar2 = strlen(in_RSI);
        if (sVar2 < 0x80) {
          strncpy(local_88,in_RSI,0x7f);
          local_88[local_ac] = '\0';
          bVar1 = Lib::Int::stringToInt(local_88,local_94);
          if (bVar1) {
            *(int *)(in_RDI + 0x98) = local_94[0];
            bVar1 = Lib::Int::stringToInt(local_88 + (long)local_ac + 1,&local_98);
            if (bVar1) {
              *(int *)(in_RDI + 0xe8) = local_98;
              if ((*(int *)(in_RDI + 0x98) == 0) && (*(int *)(in_RDI + 0xe8) == 0)) {
                local_b3 = false;
              }
              else {
                local_b3 = true;
              }
            }
            else {
              local_b3 = false;
            }
          }
          else {
            local_b3 = false;
          }
        }
        else {
          local_b3 = false;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x98) = 1;
        bVar1 = Lib::Int::stringToInt(in_RSI,&local_9c);
        if (bVar1) {
          *(int *)(in_RDI + 0xe8) = local_9c;
          local_b3 = true;
        }
        else {
          local_b3 = false;
        }
      }
      return local_b3;
    }
    if (in_RSI[local_ac] == in_DL) {
      bVar1 = true;
      goto LAB_005a0b15;
    }
    local_ac = local_ac + 1;
  } while( true );
}

Assistant:

bool Options::RatioOptionValue::readRatio(const char* val, char separator)
{
  // search the string for ":"
  bool found = false;
  int colonIndex = 0;
  while (val[colonIndex]) {
    if (val[colonIndex] == separator) {
      found = true;
      break;
    }
    colonIndex++;
  }

  if (found) {
    if (strlen(val) >= COPY_SIZE) {
      return false;
    }
    char copy[COPY_SIZE];
    strncpy(copy,val,COPY_SIZE - 1); // leave space for trailing NUL
    copy[colonIndex] = 0;
    int age;
    if (! Int::stringToInt(copy,age)) {
      return false;
    }
    actualValue = age;
    int weight;
    if (! Int::stringToInt(copy+colonIndex+1,weight)) {
      return false;
    }
    otherValue = weight;

    // don't allow ratios 0:0
    if (actualValue == 0 && otherValue == 0) {
      return false;
    }

    return true;
  }
  actualValue = 1;
  int weight;
  if (! Int::stringToInt(val,weight)) {
    return false;
  }
  otherValue = weight;
  return true;
}